

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O3

bool __thiscall draco::ObjEncoder::EncodePositions(ObjEncoder *this)

{
  EncoderBuffer *pEVar1;
  bool bVar2;
  PointAttribute *this_00;
  AttributeValueIndex i;
  AttributeValueIndex att_id;
  array<float,_3UL> value;
  float local_3c [3];
  
  bVar2 = false;
  this_00 = PointCloud::GetNamedAttribute(this->in_point_cloud_,POSITION);
  if (this_00 != (PointAttribute *)0x0) {
    att_id.value_ = 0;
    if (this_00->num_unique_entries_ == 0) {
      bVar2 = false;
    }
    else {
      do {
        bVar2 = GeometryAttribute::ConvertValue<float>
                          (&this_00->super_GeometryAttribute,att_id,'\x03',local_3c);
        if (!bVar2) {
          return bVar2;
        }
        pEVar1 = this->out_buffer_;
        if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar1,
                     (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,"v ","");
        }
        EncodeFloatList(this,local_3c,3);
        pEVar1 = this->out_buffer_;
        if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar1,
                     (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,"\n","");
        }
        att_id.value_ = att_id.value_ + 1;
      } while (att_id.value_ < this_00->num_unique_entries_);
      this->pos_att_ = this_00;
    }
  }
  return bVar2;
}

Assistant:

bool ObjEncoder::EncodePositions() {
  const PointAttribute *const att =
      in_point_cloud_->GetNamedAttribute(GeometryAttribute::POSITION);
  if (att == nullptr || att->size() == 0) {
    return false;  // Position attribute must be valid.
  }
  std::array<float, 3> value;
  for (AttributeValueIndex i(0); i < static_cast<uint32_t>(att->size()); ++i) {
    if (!att->ConvertValue<float, 3>(i, &value[0])) {
      return false;
    }
    buffer()->Encode("v ", 2);
    EncodeFloatList(&value[0], 3);
    buffer()->Encode("\n", 1);
  }
  pos_att_ = att;
  return true;
}